

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O0

void predict<false>(mf *data,single_learner *base,example *ec)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  reference pbVar4;
  uchar *puVar5;
  size_t sVar6;
  v_array<unsigned_char> *in_RDX;
  long in_RDI;
  float fVar7;
  float x_dot_r;
  float x_dot_l;
  size_t k;
  int right_ns;
  int left_ns;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  float prediction;
  shared_data *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  uchar in_stack_ffffffffffffffa6;
  uchar in_stack_ffffffffffffffa7;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  v_array<unsigned_char> *in_stack_ffffffffffffffb0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  long local_28;
  undefined1 local_1d;
  float local_1c;
  v_array<unsigned_char> *local_18;
  long local_8;
  
  local_1c = 0.0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)in_stack_ffffffffffffffb0,
             (example *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  local_1c = *(float *)&local_18[0x345]._end + local_1c;
  copy_array<unsigned_char>
            (in_stack_ffffffffffffffb0,
             (v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            );
  v_array<unsigned_char>::clear
            ((v_array<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  local_1d = 0;
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             (uchar *)in_stack_ffffffffffffff98);
  local_28 = local_8;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_ffffffffffffff98);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffa7,
                                        CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0
                                                )),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff98), bVar3) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)pbVar4);
    uVar1 = *puVar5;
    puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)pbVar4);
    uVar2 = *puVar5;
    sVar6 = features::size((features *)0x2d22ed);
    if ((sVar6 != 0) && (sVar6 = features::size((features *)0x2d2311), sVar6 != 0)) {
      for (in_stack_ffffffffffffffb0 = (v_array<unsigned_char> *)0x1;
          in_stack_ffffffffffffffb0 <= *(v_array<unsigned_char> **)(local_8 + 0x18);
          in_stack_ffffffffffffffb0 =
               (v_array<unsigned_char> *)((long)&in_stack_ffffffffffffffb0->_begin + 1)) {
        in_stack_ffffffffffffffa6 = uVar1;
        puVar5 = v_array<unsigned_char>::operator[](local_18,0);
        *puVar5 = in_stack_ffffffffffffffa6;
        LEARNER::learner<char,_example>::predict
                  ((learner<char,_example> *)in_stack_ffffffffffffffb0,
                   (example *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   CONCAT17(in_stack_ffffffffffffffa7,
                            CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
        in_stack_ffffffffffffffac = *(float *)&local_18[0x345]._end;
        in_stack_ffffffffffffffa7 = uVar2;
        puVar5 = v_array<unsigned_char>::operator[](local_18,0);
        *puVar5 = in_stack_ffffffffffffffa7;
        LEARNER::learner<char,_example>::predict
                  ((learner<char,_example> *)in_stack_ffffffffffffffb0,
                   (example *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   CONCAT17(in_stack_ffffffffffffffa7,
                            CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
        in_stack_ffffffffffffffa8 = *(float *)&local_18[0x345]._end;
        local_1c = in_stack_ffffffffffffffac * in_stack_ffffffffffffffa8 + local_1c;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  copy_array<unsigned_char>
            (in_stack_ffffffffffffffb0,
             (v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            );
  *(float *)&local_18[0x345]._end = local_1c;
  fVar7 = GD::finalize_prediction(in_stack_ffffffffffffff98,0.0);
  *(float *)&local_18[0x342].end_array = fVar7;
  return;
}

Assistant:

void predict(mf& data, single_learner& base, example& ec)
{
  float prediction = 0;
  if (cache_sub_predictions)
    data.sub_predictions.resize(2 * data.rank + 1);

  // predict from linear terms
  base.predict(ec);

  // store linear prediction
  if (cache_sub_predictions)
    data.sub_predictions[0] = ec.partial_prediction;
  prediction += ec.partial_prediction;

  // store namespace indices
  copy_array(data.predict_indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // add interaction terms to prediction
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      for (size_t k = 1; k <= data.rank; k++)
      {
        ec.indices[0] = left_ns;

        // compute l^k * x_l using base learner
        base.predict(ec, k);
        float x_dot_l = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k - 1] = x_dot_l;

        // set example to right namespace only
        ec.indices[0] = right_ns;

        // compute r^k * x_r using base learner
        base.predict(ec, k + data.rank);
        float x_dot_r = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k] = x_dot_r;

        // accumulate prediction
        prediction += (x_dot_l * x_dot_r);
      }
    }
  }
  // restore namespace indices and label
  copy_array(ec.indices, data.predict_indices);

  // finalize prediction
  ec.partial_prediction = prediction;
  ec.pred.scalar = GD::finalize_prediction(data.all->sd, ec.partial_prediction);
}